

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

void __thiscall JUnitTestOutput::resetTestGroupResult(JUnitTestOutput *this)

{
  JUnitTestOutputImpl *pJVar1;
  JUnitTestCaseResultNode *pJVar2;
  JUnitTestCaseResultNode *this_00;
  SimpleString local_20;
  
  pJVar1 = this->impl_;
  (pJVar1->results_).testCount_ = 0;
  (pJVar1->results_).failureCount_ = 0;
  SimpleString::SimpleString(&local_20,"");
  SimpleString::operator=(&(this->impl_->results_).group_,&local_20);
  SimpleString::~SimpleString(&local_20);
  this_00 = (this->impl_->results_).head_;
  while (this_00 != (JUnitTestCaseResultNode *)0x0) {
    pJVar2 = this_00->next_;
    if (this_00->failure_ != (TestFailure *)0x0) {
      (*this_00->failure_->_vptr_TestFailure[1])();
    }
    SimpleString::~SimpleString(&this_00->name_);
    operator_delete(this_00,0x28);
    this_00 = pJVar2;
  }
  pJVar1 = this->impl_;
  (pJVar1->results_).head_ = (JUnitTestCaseResultNode *)0x0;
  (pJVar1->results_).tail_ = (JUnitTestCaseResultNode *)0x0;
  return;
}

Assistant:

void JUnitTestOutput::resetTestGroupResult()
{
    impl_->results_.testCount_ = 0;
    impl_->results_.failureCount_ = 0;
    impl_->results_.group_ = "";
    JUnitTestCaseResultNode* cur = impl_->results_.head_;
    while (cur) {
        JUnitTestCaseResultNode* tmp = cur->next_;
        ;
        delete cur->failure_;
        delete cur;
        cur = tmp;
    }
    impl_->results_.head_ = 0;
    impl_->results_.tail_ = 0;
}